

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O2

void nn_node_dump(nn_trie_node *self,int indent)

{
  byte bVar1;
  uint uVar2;
  char *__s;
  ulong uVar3;
  char *__s_00;
  
  nn_node_indent(indent);
  if (self == (nn_trie_node *)0x0) {
    __s_00 = "NULL";
  }
  else {
    __s_00 = "===================";
    puts("===================");
    nn_node_indent(indent);
    uVar3 = 0;
    printf("refcount=%d\n",(ulong)self->refcount);
    nn_node_indent(indent);
    printf("prefix_len=%d\n",(ulong)self->prefix_len);
    nn_node_indent(indent);
    __s = "type=sparse";
    if (self->type == '\t') {
      __s = "type=dense";
    }
    puts(__s);
    nn_node_indent(indent);
    printf("prefix=\"");
    for (; uVar3 != self->prefix_len; uVar3 = uVar3 + 1) {
      nn_node_putchar(self->prefix[uVar3]);
    }
    puts("\"");
    bVar1 = self->type;
    nn_node_indent(indent);
    if (bVar1 < 9) {
      printf("sparse.children=\"");
      for (uVar3 = 0; uVar3 != self->type; uVar3 = uVar3 + 1) {
        nn_node_putchar(self->prefix[uVar3 + 10]);
      }
      puts("\"");
      uVar2 = (uint)self->type;
    }
    else {
      bVar1 = (self->u).sparse.children[0];
      printf("dense.min=\'%c\' (%d)\n",(ulong)(uint)(int)(char)bVar1,(ulong)bVar1);
      nn_node_indent(indent);
      bVar1 = (self->u).sparse.children[1];
      printf("dense.max=\'%c\' (%d)\n",(ulong)(uint)(int)(char)bVar1,(ulong)bVar1);
      nn_node_indent(indent);
      printf("dense.nbr=%d\n",(ulong)(self->u).dense.nbr);
      uVar2 = ((uint)(self->u).sparse.children[1] - (uint)(self->u).sparse.children[0]) + 1;
    }
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      nn_node_dump(*(nn_trie_node **)(self[1].prefix + uVar3 * 8 + -6),indent + 1);
    }
    nn_node_indent(indent);
  }
  puts(__s_00);
  return;
}

Assistant:

void nn_node_dump (struct nn_trie_node *self, int indent)
{
    int i;
    int children;

    if (!self) {
        nn_node_indent (indent);
        printf ("NULL\n");
        return;
    }

    nn_node_indent (indent);
    printf ("===================\n");
    nn_node_indent (indent);
    printf ("refcount=%d\n", (int) self->refcount);
    nn_node_indent (indent);
    printf ("prefix_len=%d\n", (int) self->prefix_len);
    nn_node_indent (indent);
    if (self->type == NN_TRIE_DENSE_TYPE)
        printf ("type=dense\n");
    else
        printf ("type=sparse\n");
    nn_node_indent (indent);
    printf ("prefix=\"");
    for (i = 0; i != self->prefix_len; ++i)
        nn_node_putchar (self->prefix [i]);
    printf ("\"\n");
    if (self->type <= 8) {
        nn_node_indent (indent);
        printf ("sparse.children=\"");
        for (i = 0; i != self->type; ++i)
            nn_node_putchar (self->u.sparse.children [i]);
        printf ("\"\n");
        children = self->type;
    }
    else {
        nn_node_indent (indent);
        printf ("dense.min='%c' (%d)\n", (char) self->u.dense.min,
            (int) self->u.dense.min);
        nn_node_indent (indent);
        printf ("dense.max='%c' (%d)\n", (char) self->u.dense.max,
            (int) self->u.dense.max);
        nn_node_indent (indent);
        printf ("dense.nbr=%d\n", (int) self->u.dense.nbr);
        children = self->u.dense.max - self->u.dense.min + 1;
    }

    for (i = 0; i != children; ++i)
        nn_node_dump (((struct nn_trie_node**) (self + 1)) [i], indent + 1);

    nn_node_indent (indent);
    printf ("===================\n");
}